

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O1

Var Js::JavascriptExternalFunction::ExternalFunctionThunk
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  ScriptContext *scriptContext;
  Var value;
  RecyclableData *pRVar6;
  RecyclableObject *pRVar7;
  void *__frameAddr;
  int in_stack_00000010;
  undefined1 local_70 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  args.super_Arguments.Values = (Type)callInfo;
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xbe,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd3873;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  __leaveScriptObject._32_8_ = args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&__leaveScriptObject.__exceptionCheck,
             (CallInfo *)&args.super_Arguments.Values);
  scriptContext = Js::Type::GetScriptContext((function->type).ptr);
  PrepareExternalCall((JavascriptExternalFunction *)function,
                      (Arguments *)&__leaveScriptObject.__exceptionCheck);
  if (scriptContext->TTDShouldPerformRecordOrReplayAction == true) {
    value = HandleRecordReplayExternalFunction_Thunk
                      ((JavascriptFunction *)function,(CallInfo *)&args.super_Arguments.Values,
                       (Arguments *)&__leaveScriptObject.__exceptionCheck,scriptContext);
  }
  else {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_70,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    value = (Var)(*(code *)function[5].type.ptr)
                           (function,args.super_Arguments.Values,args.super_Arguments.Info);
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&scriptContext->threadContext->recyclableData);
    if ((pRVar6->exceptionObject).ptr != (JavascriptExceptionObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                  ,0xd7,"(!scriptContext->HasRecordedException())",
                                  "!scriptContext->HasRecordedException()");
      if (!bVar4) {
LAB_00bd3873:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_70);
  }
  if (value == (Var)0x0) {
    pRVar7 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)CrossSite::MarshalVar(scriptContext,value,false);
  }
  return pRVar7;
}

Assistant:

Var JavascriptExternalFunction::ExternalFunctionThunk(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        ScriptContext * scriptContext = externalFunction->type->GetScriptContext();

#ifdef ENABLE_DIRECTCALL_TELEMETRY
        DirectCallTelemetry::AutoLogger logger(scriptContext, externalFunction, &args);
#endif

        externalFunction->PrepareExternalCall(&args);

#if ENABLE_TTD
        Var result = nullptr;

        if(scriptContext->ShouldPerformRecordOrReplayAction())
        {
            result = JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk(externalFunction, callInfo, args, scriptContext);
        }
        else
        {
            BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
            {
                // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
                result = externalFunction->nativeMethod(function, callInfo, args.Values);
            }
            END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);
        }
#else
        Var result = nullptr;
        BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
        {
            // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
            result = externalFunction->nativeMethod(function, callInfo, args.Values);
        }
        END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);
#endif

        if (result == nullptr)
        {
#pragma warning(push)
#pragma warning(disable:6011) // scriptContext cannot be null here
            result = scriptContext->GetLibrary()->GetUndefined();
#pragma warning(pop)
        }
        else
        {
            result = CrossSite::MarshalVar(scriptContext, result);
        }

        return result;
    }